

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralMeshDenoising.cpp
# Opt level: O1

void __thiscall BilateralMeshDenoising::initParameters(BilateralMeshDenoising *this)

{
  ParameterSet *this_00;
  string local_40;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  this_00 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Iteration Num.","");
  ParameterSet::addParameter(this_00,&local_40,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BilateralMeshDenoising::initParameters()
{
    parameter_set_->removeAllParameter();
    parameter_set_->addParameter(string("Iteration Num."), 5);
}